

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

uint anon_unknown.dwarf_6f1cc::GetDerivedFromDepth(TypeClass *type,TypeClass *target)

{
  uint local_24;
  uint depth;
  TypeClass *target_local;
  TypeClass *type_local;
  
  local_24 = 0;
  target_local = type;
  while( true ) {
    if (target_local == (TypeClass *)0x0) {
      return 0xffffffff;
    }
    if (target == target_local) break;
    local_24 = local_24 + 1;
    target_local = target_local->baseClass;
  }
  return local_24;
}

Assistant:

unsigned GetDerivedFromDepth(TypeClass *type, TypeClass *target)
	{
		unsigned depth = 0;

		while(type)
		{
			if(target == type)
				return depth;

			depth++;

			type = type->baseClass;
		}

		return ~0u;
	}